

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::AddTapscriptSignTxInRequest::AddTapscriptSignTxInRequest
          (AddTapscriptSignTxInRequest *this)

{
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  AddTapscriptSignTxInRequest *local_10;
  AddTapscriptSignTxInRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::AddTapscriptSignTxInRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::AddTapscriptSignTxInRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::AddTapscriptSignTxInRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__AddTapscriptSignTxInRequest_01b41a18;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->txid_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->vout_ = 0;
  core::
  JsonObjectVector<cfd::js::api::json::TapScriptSignData,_cfd::js::api::TapScriptSignDataStruct>::
  JsonObjectVector(&this->sign_params_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tapscript_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->control_block_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->annex_,"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  CollectFieldName();
  return;
}

Assistant:

AddTapscriptSignTxInRequest() {
    CollectFieldName();
  }